

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

void tcu::anon_unknown_3::genScreenSpaceLines
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                *screenspaceLines,
               vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               *lines,IVec2 *viewportSize)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pSVar4;
  long lVar5;
  int lineNdx;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  
  lVar5 = 0;
  for (lVar6 = 0;
      pSVar4 = (lines->
               super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)((ulong)((long)(lines->
                                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) >> 6);
      lVar6 = lVar6 + 1) {
    auVar7._8_8_ = *(undefined8 *)(pSVar4->positions[1].m_data + lVar5);
    auVar7._0_8_ = *(undefined8 *)(pSVar4->positions[0].m_data + lVar5);
    uVar2 = pSVar4->colors[0].m_data[lVar5 + 0xffffffffffffffff];
    uVar3 = pSVar4->positions[0].m_data[lVar5 + 3];
    auVar8._4_4_ = uVar3;
    auVar8._0_4_ = uVar3;
    auVar8._8_4_ = uVar2;
    auVar8._12_4_ = uVar2;
    auVar8 = divps(auVar7,auVar8);
    fVar9 = (float)(int)*(undefined8 *)viewportSize->m_data;
    fVar10 = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
    pfVar1 = (float *)((long)((screenspaceLines->
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar5);
    *pfVar1 = (auVar8._0_4_ + 1.0) * 0.5 * fVar9;
    pfVar1[1] = (auVar8._4_4_ + 1.0) * 0.5 * fVar10;
    pfVar1[2] = (auVar8._8_4_ + 1.0) * 0.5 * fVar9;
    pfVar1[3] = (auVar8._12_4_ + 1.0) * 0.5 * fVar10;
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

void genScreenSpaceLines (std::vector<tcu::Vec4>& screenspaceLines, const std::vector<LineSceneSpec::SceneLine>& lines, const tcu::IVec2& viewportSize)
{
	DE_ASSERT(screenspaceLines.size() == lines.size());

	for (int lineNdx = 0; lineNdx < (int)lines.size(); ++lineNdx)
	{
		const tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(lines[lineNdx].positions[0].x() / lines[lineNdx].positions[0].w(), lines[lineNdx].positions[0].y() / lines[lineNdx].positions[0].w()),
			tcu::Vec2(lines[lineNdx].positions[1].x() / lines[lineNdx].positions[1].w(), lines[lineNdx].positions[1].y() / lines[lineNdx].positions[1].w()),
		};
		const tcu::Vec4 lineScreenSpace[2] =
		{
			tcu::Vec4((lineNormalizedDeviceSpace[0].x() + 1.0f) * 0.5f * (float)viewportSize.x(), (lineNormalizedDeviceSpace[0].y() + 1.0f) * 0.5f * (float)viewportSize.y(), 0.0f, 1.0f),
			tcu::Vec4((lineNormalizedDeviceSpace[1].x() + 1.0f) * 0.5f * (float)viewportSize.x(), (lineNormalizedDeviceSpace[1].y() + 1.0f) * 0.5f * (float)viewportSize.y(), 0.0f, 1.0f),
		};

		screenspaceLines[lineNdx] = tcu::Vec4(lineScreenSpace[0].x(), lineScreenSpace[0].y(), lineScreenSpace[1].x(), lineScreenSpace[1].y());
	}
}